

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::DerivateUniformSetup::setup
          (DerivateUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *param_2)

{
  DataType dataType;
  int iVar1;
  long lVar2;
  DerivateCaseValues values;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar2 = __dynamic_cast(instance,&ShaderRenderCaseInstance::typeinfo,
                         &sr::(anonymous_namespace)::TriangleDerivateCaseInstance::typeinfo,0);
  if (lVar2 != 0) {
    dataType = *(DataType *)(*(long *)(lVar2 + 0x210) + 4);
    lVar2 = __dynamic_cast(instance,&ShaderRenderCaseInstance::typeinfo,
                           &sr::(anonymous_namespace)::TriangleDerivateCaseInstance::typeinfo,0);
    if (lVar2 != 0) {
      lVar2 = *(long *)(lVar2 + 0x218);
      local_48 = *(undefined8 *)(lVar2 + 0x20);
      uStack_40 = *(undefined8 *)(lVar2 + 0x28);
      local_38 = *(undefined8 *)(lVar2 + 0x30);
      uStack_30 = *(undefined8 *)(lVar2 + 0x38);
      iVar1 = glu::getDataTypeScalarSize(dataType);
      ShaderRenderCaseInstance::addUniform
                (instance,0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(long)iVar1 << 2,&local_48);
      iVar1 = glu::getDataTypeScalarSize(dataType);
      ShaderRenderCaseInstance::addUniform
                (instance,1,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(long)iVar1 << 2,&local_38);
      if (this->m_useSampler == true) {
        ShaderRenderCaseInstance::useSampler(instance,2,0);
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void DerivateUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4&) const
{
	DerivateCaseDefinition	definitions		= dynamic_cast<TriangleDerivateCaseInstance&>(instance).getDerivateCaseDefinition();
	DerivateCaseValues		values			= dynamic_cast<TriangleDerivateCaseInstance&>(instance).getDerivateCaseValues();

	DE_ASSERT(glu::isDataTypeFloatOrVec(definitions.dataType));

	instance.addUniform(0u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, glu::getDataTypeScalarSize(definitions.dataType) * sizeof(float), values.derivScale.getPtr());
	instance.addUniform(1u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, glu::getDataTypeScalarSize(definitions.dataType) * sizeof(float), values.derivBias.getPtr());

	if (m_useSampler)
		instance.useSampler(2u, 0u); // To the uniform binding location 2 bind the texture 0
}